

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raytraced_renderer.cpp
# Opt level: O1

void __thiscall CGL::RaytracedRenderer::visualize_accel(RaytracedRenderer *this)

{
  Color *pCVar1;
  BVHNode *pBVar2;
  _Elt_pointer ppBVar3;
  pointer pLVar4;
  Color *pCVar5;
  BVHAccel *pBVar6;
  ulong uVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 in_register_00001304 [12];
  Color CVar16;
  Color CVar17;
  Color CVar18;
  stack<CGL::SceneObjects::BVHNode_*,_std::deque<CGL::SceneObjects::BVHNode_*,_std::allocator<CGL::SceneObjects::BVHNode_*>_>_>
  tstack;
  undefined1 local_e8 [48];
  _Elt_pointer local_b8;
  _Elt_pointer ppBStack_b0;
  _Elt_pointer ppBStack_a8;
  _Map_pointer pppBStack_a0;
  double local_90;
  undefined8 local_88;
  BVHNode *local_80;
  undefined8 local_78;
  undefined4 local_70;
  undefined8 local_68;
  undefined4 local_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  double dStack_40;
  double local_38;
  double dStack_30;
  
  glPushAttrib(0x2000);
  glDisable(0xb50);
  glLineWidth(0x3f800000);
  glEnable(0xb71);
  auVar9._8_4_ = 0x3f19999a;
  auVar9._0_8_ = 0x3f19999a3f19999a;
  auVar9._12_4_ = 0x3f19999a;
  vmovlps_avx(auVar9);
  auVar10._8_4_ = 0x3f4ccccd;
  auVar10._0_8_ = 0x3f4ccccd3f4ccccd;
  auVar10._12_4_ = 0x3f4ccccd;
  local_68 = vmovlps_avx(auVar10);
  local_60 = 0x3f800000;
  local_78 = 0;
  local_70 = 0;
  ppBVar3 = (this->selectionHistory).c.
            super__Deque_base<CGL::SceneObjects::BVHNode_*,_std::allocator<CGL::SceneObjects::BVHNode_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppBVar3 ==
      (this->selectionHistory).c.
      super__Deque_base<CGL::SceneObjects::BVHNode_*,_std::allocator<CGL::SceneObjects::BVHNode_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    ppBVar3 = (this->selectionHistory).c.
              super__Deque_base<CGL::SceneObjects::BVHNode_*,_std::allocator<CGL::SceneObjects::BVHNode_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  pCVar1 = (Color *)ppBVar3[-1];
  glPolygonOffset(0x3f800000,0x3f800000);
  glEnable(0x8037);
  pBVar6 = this->bvh;
  pCVar5 = pCVar1;
  if (*(long *)&pCVar1[8].b != 0 || *(Color **)(pCVar1 + 8) != (Color *)0x0) {
    CGL::SceneObjects::BVHAccel::draw((BVHNode *)pBVar6,*(Color **)(pCVar1 + 8),1.0);
    pBVar6 = this->bvh;
    pCVar5 = *(Color **)&pCVar1[8].b;
  }
  CGL::SceneObjects::BVHAccel::draw((BVHNode *)pBVar6,pCVar5,1.0);
  glDisable(0x8037);
  CGL::SceneObjects::BVHAccel::drawOutline((BVHNode *)this->bvh,pCVar1,0.5);
  glDepthMask(0);
  local_e8._32_16_ = ZEXT816(0) << 0x40;
  ppBStack_a8 = (_Elt_pointer)0x0;
  pppBStack_a0 = (_Map_pointer)0x0;
  local_b8 = (_Elt_pointer)0x0;
  ppBStack_b0 = (_Elt_pointer)0x0;
  local_e8._0_32_ = ZEXT1632(local_e8._32_16_);
  std::_Deque_base<CGL::SceneObjects::BVHNode_*,_std::allocator<CGL::SceneObjects::BVHNode_*>_>::
  _M_initialize_map((_Deque_base<CGL::SceneObjects::BVHNode_*,_std::allocator<CGL::SceneObjects::BVHNode_*>_>
                     *)local_e8,0);
  local_80 = *(BVHNode **)(this->bvh + 0x48);
  if (local_b8 == ppBStack_a8 + -1) {
    std::deque<CGL::SceneObjects::BVHNode*,std::allocator<CGL::SceneObjects::BVHNode*>>::
    _M_push_back_aux<CGL::SceneObjects::BVHNode*>
              ((deque<CGL::SceneObjects::BVHNode*,std::allocator<CGL::SceneObjects::BVHNode*>> *)
               local_e8,&local_80);
  }
  else {
    *local_b8 = local_80;
    local_b8 = local_b8 + 1;
  }
  if (local_b8 != (_Elt_pointer)local_e8._16_8_) {
    do {
      ppBVar3 = local_b8;
      if (local_b8 == ppBStack_b0) {
        ppBVar3 = pppBStack_a0[-1] + 0x40;
      }
      pBVar2 = ppBVar3[-1];
      if (local_b8 == ppBStack_b0) {
        operator_delete(ppBStack_b0);
        ppBStack_b0 = pppBStack_a0[-1];
        ppBStack_a8 = ppBStack_b0 + 0x40;
        local_b8 = ppBStack_b0 + 0x3f;
        pppBStack_a0 = pppBStack_a0 + -1;
      }
      else {
        local_b8 = local_b8 + -1;
      }
      CVar16.b = 0.5;
      CVar16.r = 0.5;
      CVar16.g = 0.5;
      CGL::BBox::draw(CVar16,0.25);
      if (*(BVHNode **)(pBVar2 + 0x60) != (BVHNode *)0x0) {
        if (local_b8 == ppBStack_a8 + -1) {
          std::deque<CGL::SceneObjects::BVHNode*,std::allocator<CGL::SceneObjects::BVHNode*>>::
          _M_push_back_aux<CGL::SceneObjects::BVHNode*const&>
                    ((deque<CGL::SceneObjects::BVHNode*,std::allocator<CGL::SceneObjects::BVHNode*>>
                      *)local_e8,(BVHNode **)(pBVar2 + 0x60));
        }
        else {
          *local_b8 = *(BVHNode **)(pBVar2 + 0x60);
          local_b8 = local_b8 + 1;
        }
      }
      if (*(BVHNode **)(pBVar2 + 0x68) != (BVHNode *)0x0) {
        if (local_b8 == ppBStack_a8 + -1) {
          std::deque<CGL::SceneObjects::BVHNode*,std::allocator<CGL::SceneObjects::BVHNode*>>::
          _M_push_back_aux<CGL::SceneObjects::BVHNode*const&>
                    ((deque<CGL::SceneObjects::BVHNode*,std::allocator<CGL::SceneObjects::BVHNode*>>
                      *)local_e8,(BVHNode **)(pBVar2 + 0x68));
        }
        else {
          *local_b8 = *(BVHNode **)(pBVar2 + 0x68);
          local_b8 = local_b8 + 1;
        }
      }
    } while (local_b8 != (_Elt_pointer)local_e8._16_8_);
  }
  lVar8._0_4_ = pCVar1[8].r;
  lVar8._4_4_ = pCVar1[8].g;
  if (lVar8 != 0) {
    CVar17.b = 1.0;
    CVar17.r = 1.0;
    CVar17.g = 1.0;
    CGL::BBox::draw(CVar17,0.6);
  }
  if (*(long *)&pCVar1[8].b != 0) {
    CVar18.b = 1.0;
    CVar18.r = 1.0;
    CVar18.g = 1.0;
    CGL::BBox::draw(CVar18,0.6);
  }
  glLineWidth(0x40400000);
  CGL::BBox::draw((Color)ZEXT812(0x3e8000003f800000),0.6);
  if (this->show_rays == true) {
    glLineWidth(0x3f800000);
    glBegin(1);
    pLVar4 = (this->rayLog).super__Vector_base<CGL::LoggedRay,_std::allocator<CGL::LoggedRay>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->rayLog).super__Vector_base<CGL::LoggedRay,_std::allocator<CGL::LoggedRay>_>._M_impl.
        super__Vector_impl_data._M_finish != pLVar4) {
      lVar8 = 0;
      uVar7 = 0;
      do {
        local_58 = *(double *)(pLVar4 + lVar8 + 0x40);
        uStack_50 = 0;
        if (0.0 <= local_58) {
          glColor4f(0x3f800000,0x3f800000,0,0x3dcccccd);
        }
        else {
          glColor4f(0x3f800000,0,0,0x3dcccccd);
          local_58 = 100000.0;
          uStack_50 = 0;
        }
        pLVar4 = (this->rayLog).super__Vector_base<CGL::LoggedRay,_std::allocator<CGL::LoggedRay>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        local_38 = *(double *)(pLVar4 + lVar8 + 0x20);
        dStack_30 = *(double *)(pLVar4 + lVar8 + 0x20 + 8);
        auVar11._0_4_ = (float)*(double *)(pLVar4 + lVar8);
        auVar11._4_12_ = in_register_00001304;
        local_88 = *(undefined8 *)(pLVar4 + lVar8 + 0x30);
        auVar13._0_4_ = (float)*(double *)(pLVar4 + lVar8 + 8);
        auVar13._4_12_ = in_register_00001304;
        local_48 = *(double *)(pLVar4 + lVar8);
        dStack_40 = *(double *)(pLVar4 + lVar8 + 8);
        local_90 = *(double *)(pLVar4 + lVar8 + 0x10);
        glVertex3f(auVar11._0_8_,auVar13._0_8_,
                   CONCAT44((int)((ulong)local_90 >> 0x20),(float)local_90));
        auVar14._0_8_ = local_58 * local_38 + local_48;
        auVar14._8_8_ = local_58 * dStack_30 + dStack_40;
        auVar12._0_4_ = (float)auVar14._0_8_;
        auVar12._4_12_ = auVar14._4_12_;
        auVar9 = vshufpd_avx(auVar14,auVar14,1);
        auVar15._0_4_ = (float)auVar9._0_8_;
        auVar15._4_12_ = auVar9._4_12_;
        glVertex3f(auVar12._0_8_,auVar15._0_8_);
        uVar7 = uVar7 + 500;
        pLVar4 = (this->rayLog).super__Vector_base<CGL::LoggedRay,_std::allocator<CGL::LoggedRay>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar8 = lVar8 + 40000;
      } while (uVar7 < (ulong)(((long)(this->rayLog).
                                      super__Vector_base<CGL::LoggedRay,_std::allocator<CGL::LoggedRay>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar4 >> 4
                               ) * -0x3333333333333333));
    }
    glEnd();
  }
  glDepthMask(1);
  glPopAttrib();
  std::_Deque_base<CGL::SceneObjects::BVHNode_*,_std::allocator<CGL::SceneObjects::BVHNode_*>_>::
  ~_Deque_base((_Deque_base<CGL::SceneObjects::BVHNode_*,_std::allocator<CGL::SceneObjects::BVHNode_*>_>
                *)local_e8);
  return;
}

Assistant:

void RaytracedRenderer::visualize_accel() const {

  glPushAttrib(GL_ENABLE_BIT);
  glDisable(GL_LIGHTING);
  glLineWidth(1);
  glEnable(GL_DEPTH_TEST);

  // hardcoded color settings
  Color cnode = Color(.5, .5, .5); float cnode_alpha = 0.25f;
  Color cnode_hl = Color(1., .25, .0); float cnode_hl_alpha = 0.6f;
  Color cnode_hl_child = Color(1., 1., 1.); float cnode_hl_child_alpha = 0.6f;

  Color cprim_hl_left = Color(.6, .6, 1.); float cprim_hl_left_alpha = 1.f;
  Color cprim_hl_right = Color(.8, .8, 1.); float cprim_hl_right_alpha = 1.f;
  Color cprim_hl_edges = Color(0., 0., 0.); float cprim_hl_edges_alpha = 0.5f;

  BVHNode *selected = selectionHistory.top();

  // render solid geometry (with depth offset)
  glPolygonOffset(1.0, 1.0);
  glEnable(GL_POLYGON_OFFSET_FILL);

  if (selected->isLeaf()) {
    bvh->draw(selected, cprim_hl_left, cprim_hl_left_alpha);
  } else {
    bvh->draw(selected->l, cprim_hl_left, cprim_hl_left_alpha);
    bvh->draw(selected->r, cprim_hl_right, cprim_hl_right_alpha);
  }

  glDisable(GL_POLYGON_OFFSET_FILL);

  // draw geometry outline
  bvh->drawOutline(selected, cprim_hl_edges, cprim_hl_edges_alpha);

  // keep depth buffer check enabled so that mesh occluded bboxes, but
  // disable depth write so that bboxes don't occlude each other.
  glDepthMask(GL_FALSE);

  // create traversal stack
  stack<BVHNode *> tstack;

  // push initial traversal data
  tstack.push(bvh->get_root());

  // draw all BVH bboxes with non-highlighted color
  while (!tstack.empty()) {

    BVHNode *current = tstack.top();
    tstack.pop();

    current->bb.draw(cnode, cnode_alpha);
    if (current->l) tstack.push(current->l);
    if (current->r) tstack.push(current->r);
  }

  // draw selected node bbox and primitives
  if (selected->l) selected->l->bb.draw(cnode_hl_child, cnode_hl_child_alpha);
  if (selected->r) selected->r->bb.draw(cnode_hl_child, cnode_hl_child_alpha);

  glLineWidth(3.f);
  selected->bb.draw(cnode_hl, cnode_hl_alpha);

  // now perform visualization of the rays
  if (show_rays) {
      glLineWidth(1.f);
      glBegin(GL_LINES);

      for (size_t i=0; i<rayLog.size(); i+=500) {

          const static double VERY_LONG = 10e4;
          double ray_t = VERY_LONG;

          // color rays that are hits yellow
          // and rays this miss all geometry red
          if (rayLog[i].hit_t >= 0.0) {
              ray_t = rayLog[i].hit_t;
              glColor4f(1.f, 1.f, 0.f, 0.1f);
          } else {
              glColor4f(1.f, 0.f, 0.f, 0.1f);
          }

          Vector3D end = rayLog[i].o + ray_t * rayLog[i].d;

          glVertex3f(rayLog[i].o[0], rayLog[i].o[1], rayLog[i].o[2]);
          glVertex3f(end[0], end[1], end[2]);
      }
      glEnd();
  }

  glDepthMask(GL_TRUE);
  glPopAttrib();
}